

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O0

void If_LibBoxPrint(FILE *pFile,If_LibBox_t *p)

{
  int iVar1;
  char *pcVar2;
  undefined8 *puVar3;
  int local_2c;
  int local_28;
  int k;
  int j;
  int i;
  If_Box_t *pBox;
  If_LibBox_t *p_local;
  FILE *pFile_local;
  
  pcVar2 = Extra_TimeStamp();
  fprintf((FILE *)pFile,"# Box library written by ABC on %s.\n",pcVar2);
  fprintf((FILE *)pFile,"# <Name> <ID> <Type> <I> <O>\n");
  for (k = 0; iVar1 = Vec_PtrSize(p->vBoxes), k < iVar1; k = k + 1) {
    puVar3 = (undefined8 *)Vec_PtrEntry(p->vBoxes,k);
    if (puVar3 != (undefined8 *)0x0) {
      fprintf((FILE *)pFile,"%s %d %d %d %d\n",*puVar3,(ulong)*(uint *)((long)puVar3 + 0xc),
              (ulong)((*(char *)((long)puVar3 + 9) != '\0' ^ 0xffU) & 1),
              (ulong)*(uint *)(puVar3 + 2),*(undefined4 *)((long)puVar3 + 0x14));
      local_28 = 0;
      while (local_28 < *(int *)((long)puVar3 + 0x14)) {
        for (local_2c = 0; local_2c < *(int *)(puVar3 + 2); local_2c = local_2c + 1) {
          if (*(int *)(puVar3[3] + (long)(local_28 * *(int *)(puVar3 + 2) + local_2c) * 4) ==
              -1000000000) {
            fprintf((FILE *)pFile,"    - ");
          }
          else {
            fprintf((FILE *)pFile,"%5d ",
                    (ulong)*(uint *)(puVar3[3] +
                                    (long)(local_28 * *(int *)(puVar3 + 2) + local_2c) * 4));
          }
        }
        local_28 = local_28 + 1;
        printf("\n");
      }
    }
  }
  return;
}

Assistant:

void If_LibBoxPrint( FILE * pFile, If_LibBox_t * p )
{
    If_Box_t * pBox;
    int i, j, k;
    fprintf( pFile, "# Box library written by ABC on %s.\n", Extra_TimeStamp() );
    fprintf( pFile, "# <Name> <ID> <Type> <I> <O>\n" );
    If_LibBoxForEachBox( p, pBox, i )
    {
        fprintf( pFile, "%s %d %d %d %d\n", pBox->pName, pBox->Id, !pBox->fBlack, pBox->nPis, pBox->nPos );
        for ( j = 0; j < pBox->nPos; j++, printf("\n") )
            for ( k = 0; k < pBox->nPis; k++ )
                if ( pBox->pDelays[j * pBox->nPis + k] == -ABC_INFINITY )
                    fprintf( pFile, "    - " );
                else
                    fprintf( pFile, "%5d ", pBox->pDelays[j * pBox->nPis + k] );
    }
}